

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O0

void CVmSaveFile::reset(void)

{
  undefined8 *puVar1;
  long *plVar2;
  err_frame_t err_cur__;
  int gc_was_enabled;
  CVmImageLoader *in_stack_00000270;
  CVmImageLoader *in_stack_00000820;
  undefined8 in_stack_ffffffffffffff08;
  int enable;
  void *pvVar3;
  CVmObjTable *in_stack_ffffffffffffff10;
  CVmObjTable *this;
  uint local_e8 [2];
  CVmObjTable *this_00;
  void *local_d8;
  CVmObjTable *in_stack_ffffffffffffff50;
  
  enable = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  CVmUndo::drop_undo((CVmUndo *)in_stack_ffffffffffffff10);
  CVmImageLoader::discard_synth_exports((CVmImageLoader *)0x388ab5);
  CVmMetaTable::forget_intrinsic_class_instances(G_meta_table_X);
  CVmObjTable::gc_full(in_stack_ffffffffffffff10);
  CVmObjTable::enable_gc(in_stack_ffffffffffffff10,enable);
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  this = (CVmObjTable *)*puVar1;
  plVar2 = (long *)_ZTW11G_err_frame();
  *plVar2 = (long)local_e8;
  local_e8[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff30);
  if (local_e8[0] == 0) {
    CVmObjTable::reset_to_image(in_stack_ffffffffffffff50);
    CVmImageLoader::do_dynamic_link(in_stack_00000820);
  }
  if ((local_e8[0] & 0x8000) == 0) {
    local_e8[0] = local_e8[0] | 0x8000;
    CVmObjTable::enable_gc(in_stack_ffffffffffffff10,enable);
  }
  this_00 = this;
  puVar1 = (undefined8 *)_ZTW11G_err_frame();
  *puVar1 = this;
  if ((local_e8[0] & 0x4001) != 0) {
    puVar1 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar1 & 2) != 0) {
      plVar2 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar2 + 0x10));
    }
    pvVar3 = local_d8;
    plVar2 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar2 + 0x10) = pvVar3;
    err_rethrow();
  }
  if ((local_e8[0] & 2) != 0) {
    free(local_d8);
  }
  CVmMetaTable::create_intrinsic_class_instances((CVmMetaTable *)this_00);
  CVmObjTable::do_all_post_load_init(this);
  CVmObjTable::gc_full(this);
  CVmImageLoader::run_static_init(in_stack_00000270);
  return;
}

Assistant:

void CVmSaveFile::reset(VMG0_)
{
    /* 
     *   discard undo information, since it applies only to the current VM
     *   state and obviously is no longer relevant after we reset to the
     *   initial state 
     */
    G_undo->drop_undo(vmg0_);

    /* 
     *   discard all synthesized exports, since we want to dynamically link
     *   to the base image file state 
     */
    G_image_loader->discard_synth_exports();

    /* forget any IntrinsicClass instances we created at startup */
	G_meta_table->forget_intrinsic_class_instances(vmg0_);

	/* 
	 *   Run GC explicitly to clear dead objects, then disable GC for the
	 *   duration of the reset.  The dynamic link step can trigger object
	 *   creation, which can trigger GC if it's enabled, but there are
	 *   assumptions (in CVmObjTADS and probably elsewhere) that GC can't
	 *   happen during image loading, and reset is a kind of loading.
	 */
	G_obj_table->gc_full(vmg0_);
	int gc_was_enabled = G_obj_table->enable_gc(vmg_ FALSE);

    err_try
	{
		/* reset all objects to initial image file load state */
		G_obj_table->reset_to_image(vmg0_);

		/* 
		 *   forget the previous dynamic linking information and relink to
		 *   the image file again - this will ensure that any objects created
		 *   after load are properly re-created now 
		 */
		G_image_loader->do_dynamic_link(vmg0_);
	}